

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

error_code __thiscall
anon_unknown.dwarf_3261e3::_remove_all_r
          (anon_unknown_dwarf_3261e3 *this,StringRef path,file_type ft,uint32_t *count)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  error_category *peVar6;
  error_category *peVar7;
  uint *puVar8;
  undefined4 in_register_0000000c;
  int *piVar9;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  ulong uVar10;
  ulong uVar11;
  StringRef SVar12;
  error_code eVar13;
  error_code ec;
  error_code ec_1;
  directory_iterator i;
  directory_iterator e;
  SmallString<128U> PathStorage;
  error_code local_1e0;
  uint local_1d0 [2];
  error_category *local_1c8;
  StringRef local_1c0;
  undefined4 local_1b0 [2];
  error_category *local_1a8;
  directory_iterator local_1a0;
  directory_iterator local_188;
  Child local_168;
  undefined8 local_160;
  Twine local_158 [5];
  Twine local_d8;
  stat local_c0;
  
  piVar9 = (int *)CONCAT44(in_register_0000000c,ft);
  local_1c0.Length = (size_t)path.Data;
  local_1c0.Data = (char *)this;
  if ((int)path.Length == 3) {
    local_1e0._M_value = 0;
    peVar6 = (error_category *)std::_V2::system_category();
    local_1e0._M_cat = peVar6;
    llvm::Twine::Twine((Twine *)&local_168,&local_1c0);
    llvm::sys::fs::directory_iterator::directory_iterator
              (&local_1a0,(Twine *)&local_168,&local_1e0,false);
    uVar11 = (ulong)(uint)local_1e0._M_value;
    peVar7 = local_1e0._M_cat;
    if (local_1e0._M_value == 0) {
      local_188.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_188.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_188.FollowSymlinks = true;
      bVar1 = llvm::sys::fs::directory_iterator::operator==(&local_1a0,&local_188);
      if (!bVar1) {
        do {
          uVar11 = (ulong)(uint)local_1e0._M_value;
          peVar7 = local_1e0._M_cat;
          if (local_1e0._M_value != 0) {
LAB_0016cfbc:
            if (local_188.State.
                super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_188.State.
                         super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            goto LAB_0016cd5c;
          }
          llvm::Twine::Twine(&local_d8,
                             &((local_1a0.State.
                                super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->CurrentEntry).Path);
          local_168.twine = local_158;
          local_160 = 0x8000000000;
          SVar12 = llvm::Twine::toNullTerminatedStringRef
                             (&local_d8,(SmallVectorImpl<char> *)&local_168);
          iVar5 = llbuild::basic::sys::lstat(SVar12.Data,&local_c0);
          if (iVar5 == 0) {
            uVar4 = (local_c0.st_mode & 0xf000) - 0x1000;
            uVar10 = 9;
            if (uVar4 < 0xc000) {
              uVar10 = (ulong)*(uint *)(&DAT_001d17d4 + (uVar4 >> 10));
            }
            local_1d0[0] = 0;
            local_1c8 = peVar6;
          }
          else {
            puVar8 = (uint *)__errno_location();
            uVar4 = *puVar8;
            local_1c8 = (error_category *)std::_V2::generic_category();
            local_1b0[0] = 2;
            local_1d0[0] = uVar4;
            local_1a8 = local_1c8;
            cVar2 = (**(code **)(*(long *)local_1c8 + 0x30))(local_1c8,uVar4,local_1b0);
            if (cVar2 == '\0') {
              bVar3 = (**(code **)(*(long *)local_1a8 + 0x38))(local_1a8,local_1d0,local_1b0[0]);
              uVar10 = (ulong)bVar3;
            }
            else {
              uVar10 = 1;
            }
          }
          peVar7 = local_1c8;
          uVar4 = local_1d0[0];
          uVar11 = (ulong)local_1d0[0];
          if (local_168.twine != local_158) {
            free(local_168.twine);
          }
          if (uVar4 != 0) goto LAB_0016cfbc;
          SVar12.Length = uVar10;
          SVar12.Data = (char *)((local_1a0.State.
                                  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->CurrentEntry).Path._M_string_length;
          eVar13 = _remove_all_r((anon_unknown_dwarf_3261e3 *)
                                 ((local_1a0.State.
                                   super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->CurrentEntry).Path._M_dataplus._M_p,SVar12,ft,count);
          if (eVar13._M_value != 0) {
            uVar11 = (ulong)(uint)eVar13._M_value;
            peVar7 = eVar13._M_cat;
            goto LAB_0016cfbc;
          }
          eVar13 = llvm::sys::fs::detail::directory_iterator_increment
                             (local_1a0.State.
                              super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
          local_1e0._M_cat = eVar13._M_cat;
          local_1e0._M_value = eVar13._M_value;
          llvm::sys::fs::directory_iterator::update_error_code_for_current_entry
                    (&local_1a0,&local_1e0);
          bVar1 = llvm::sys::fs::directory_iterator::operator==(&local_1a0,&local_188);
        } while (!bVar1);
      }
      if (local_188.State.
          super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_188.State.
                   super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      llvm::Twine::Twine((Twine *)&local_168,&local_1c0);
      bVar1 = false;
      uVar4 = llvm::sys::fs::remove((fs *)&local_168.character,(char *)0x0);
      uVar11 = (ulong)uVar4;
      peVar7 = extraout_RDX_00;
      if (uVar4 == 0) {
        *piVar9 = *piVar9 + 1;
        bVar1 = true;
      }
    }
    else {
LAB_0016cd5c:
      bVar1 = false;
    }
    if (local_1a0.State.
        super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.State.
                 super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (!bVar1) goto LAB_0016ce18;
  }
  else {
    llvm::Twine::Twine((Twine *)&local_168,&local_1c0);
    uVar4 = llvm::sys::fs::remove((fs *)&local_168.character,(char *)0x0);
    if (uVar4 != 0) {
      uVar11 = (ulong)uVar4;
      peVar7 = extraout_RDX;
      goto LAB_0016ce18;
    }
    *piVar9 = *piVar9 + 1;
  }
  uVar11 = 0;
  peVar7 = (error_category *)std::_V2::system_category();
LAB_0016ce18:
  eVar13._M_cat = peVar7;
  eVar13._0_8_ = uVar11;
  return eVar13;
}

Assistant:

error_code _remove_all_r(StringRef path, file_type ft, uint32_t &count) {
    if (ft == file_type::directory_file) {
      error_code ec;
      // For removal purposes, we should not follow through symlinks. Rather,
      // we just want to remove the symlink itself.
      directory_iterator i(path, ec, /* FollowSymlinks */ false);
      if (ec)
        return ec;

      for (directory_iterator e; i != e; i.increment(ec)) {
        if (ec)
          return ec;

        file_status st;

        if (error_code ec = link_status(i->path(), st))
          return ec;

        if (error_code ec = _remove_all_r(i->path(), st.type(), count))
          return ec;
      }

      if (error_code ec = remove(path, false))
        return ec;

      ++count; // Include the directory itself in the items removed.
    } else {
      if (error_code ec = remove(path, false))
        return ec;

      ++count;
    }

    return error_code();
  }